

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

double __thiscall soplex::SLUFactor<double>::matrixMetric(SLUFactor<double> *this,int type)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double local_38;
  double local_20;
  
  iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[4])();
  if (iVar2 == 0) {
    local_38 = 1.0;
  }
  else if (type == 0) {
    local_38 = ABS(*(this->super_CLUFactor<double>).diag.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[4])(this);
    local_20 = local_38;
    if (1 < iVar2) {
      lVar3 = 1;
      do {
        dVar4 = ABS((this->super_CLUFactor<double>).diag.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3]);
        dVar1 = dVar4;
        if ((dVar4 < local_20) || (dVar1 = local_20, dVar4 <= local_38)) {
          local_20 = dVar1;
          dVar4 = local_38;
        }
        local_38 = dVar4;
        lVar3 = lVar3 + 1;
        iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[4])(this);
      } while (lVar3 < iVar2);
    }
    local_38 = local_38 / local_20;
  }
  else {
    local_38 = 0.0;
    if (type == 1) {
      iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[4])(this);
      local_38 = 0.0;
      if (0 < iVar2) {
        lVar3 = 0;
        do {
          local_38 = local_38 +
                     1.0 / (this->super_CLUFactor<double>).diag.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar3];
          lVar3 = lVar3 + 1;
          iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[4])(this);
        } while (lVar3 < iVar2);
      }
    }
    else if (type == 2) {
      iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[4])(this);
      local_38 = 1.0;
      if (0 < iVar2) {
        local_38 = 1.0;
        lVar3 = 0;
        do {
          local_38 = local_38 *
                     (this->super_CLUFactor<double>).diag.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3];
          lVar3 = lVar3 + 1;
          iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[4])(this);
        } while (lVar3 < iVar2);
      }
      local_38 = 1.0 / local_38;
    }
  }
  return local_38;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}